

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlNodeRemoveNsDef(PyObject *self,PyObject *args)

{
  long lVar1;
  xmlNsPtr pxVar2;
  int iVar3;
  PyObject *pPVar4;
  xmlNsPtr pxVar5;
  xmlNsPtr ns;
  xmlNsPtr pxVar6;
  xmlChar *href;
  PyObject *pyobj_node;
  long local_28;
  undefined *local_20;
  
  pPVar4 = (PyObject *)0x0;
  iVar3 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlNodeRemoveNsDef",&local_20);
  if (iVar3 != 0) {
    if (((local_20 == &_Py_NoneStruct) || (lVar1 = *(long *)(local_20 + 0x10), lVar1 == 0)) ||
       (*(int *)(lVar1 + 8) != 1)) {
      pPVar4 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    else {
      pxVar6 = (xmlNsPtr)(lVar1 + 0x60);
      if (local_28 == 0) {
        ns = pxVar6->next;
      }
      else {
        pxVar2 = (xmlNsPtr)0x0;
        ns = pxVar6;
        do {
          pxVar5 = pxVar2;
          ns = ns->next;
          if (ns == (xmlNsPtr)0x0) {
            ns = (xmlNsPtr)0x0;
            goto LAB_0013a4ce;
          }
          iVar3 = xmlStrEqual(ns->href,local_28);
          pxVar2 = ns;
        } while (iVar3 == 0);
        if (pxVar5 != (xmlNsPtr)0x0) {
          pxVar6 = pxVar5;
        }
        pxVar6->next = ns->next;
        pxVar6 = ns;
      }
      pxVar6->next = (_xmlNs *)0x0;
LAB_0013a4ce:
      pPVar4 = libxml_xmlNsPtrWrap(ns);
    }
  }
  return pPVar4;
}

Assistant:

PyObject *
libxml_xmlNodeRemoveNsDef(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    xmlNsPtr ns, prev;
    xmlNodePtr node;
    PyObject *pyobj_node;
    xmlChar *href;
    xmlNsPtr c_retval;

    if (!PyArg_ParseTuple
        (args, (char *) "Oz:xmlNodeRemoveNsDef", &pyobj_node, &href))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    ns = NULL;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) {
        Py_INCREF(Py_None);
        return (Py_None);
    }

    if (href == NULL) {
	ns = node->nsDef;
	node->nsDef = NULL;
	c_retval = 0;
    }
    else {
	prev = NULL;
	ns = node->nsDef;
	while (ns != NULL) {
	    if (xmlStrEqual(ns->href, href)) {
		if (prev != NULL)
		    prev->next = ns->next;
		else
		    node->nsDef = ns->next;
		ns->next = NULL;
		c_retval = 0;
		break;
	    }
	    prev = ns;
	    ns = ns->next;
	}
    }

    c_retval = ns;
    py_retval = libxml_xmlNsPtrWrap((xmlNsPtr) c_retval);
    return (py_retval);
}